

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O0

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::Fasttrack(Fasttrack<std::shared_mutex> *this)

{
  Fasttrack<std::shared_mutex> *this_local;
  
  Detector::Detector(&this->super_Detector);
  (this->super_Detector)._vptr_Detector = (_func_int **)&PTR_init_0016b600;
  phmap::
  parallel_flat_hash_map<unsigned_long,_unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_4UL,_phmap::NullMutex>
  ::parallel_flat_hash_map(&this->allocs);
  phmap::
  parallel_node_hash_map<unsigned_long,_VarState,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>,_4UL,_phmap::NullMutex>
  ::parallel_node_hash_map(&this->vars);
  phmap::
  flat_hash_map<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  ::flat_hash_map(&this->locks);
  phmap::
  flat_hash_map<unsigned_long,_std::shared_ptr<ThreadState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  ::flat_hash_map(&this->threads);
  phmap::
  parallel_flat_hash_map<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>,_4UL,_phmap::NullMutex>
  ::parallel_flat_hash_map(&this->happens_states);
  this->log_flag = false;
  log_counters::log_counters(&this->log_count);
  std::shared_mutex::shared_mutex(&this->g_lock);
  ipc::spinlock::spinlock(&this->vars_spl);
  return;
}

Assistant:

explicit Fasttrack() = default;